

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTKData.h
# Opt level: O1

void __thiscall
Detail::VTKPointDescriptorEntryImpl<MercuryParticle<3UL>,_unsigned_long>::
VTKPointDescriptorEntryImpl
          (VTKPointDescriptorEntryImpl<MercuryParticle<3UL>,_unsigned_long> *this,string *name,
          offset_in_MercuryParticle<3UL>_to_unsigned_long member,size_t nComponents)

{
  pointer pcVar1;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_VTKPointDescriptorEntry<MercuryParticle<3UL>_>)._vptr_VTKPointDescriptorEntry =
       (_func_int **)&PTR__VTKPointDescriptorEntry_0010fb60;
  (this->super_VTKPointDescriptorEntry<MercuryParticle<3UL>_>).name_._M_dataplus._M_p =
       (pointer)&(this->super_VTKPointDescriptorEntry<MercuryParticle<3UL>_>).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_VTKPointDescriptorEntry<MercuryParticle<3UL>_>).name_,local_48,
             local_48 + local_40);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  (this->super_VTKPointDescriptorEntry<MercuryParticle<3UL>_>)._vptr_VTKPointDescriptorEntry =
       (_func_int **)&PTR__VTKPointDescriptorEntry_0010fbe8;
  this->member_ = member;
  this->nComponents_ = nComponents;
  return;
}

Assistant:

VTKPointDescriptorEntryImpl(std::string name, V T::*member, std::size_t nComponents)
        : VTKPointDescriptorEntry<T>(name), member_(member), nComponents_(nComponents)
      { }